

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_wc.cpp
# Opt level: O2

bool __thiscall CmdWc::Execute(CmdWc *this)

{
  StrList *pSVar1;
  bool bVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *p;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  FileType FVar8;
  int iVar9;
  ostream *poVar10;
  _List_node_base *p_Var11;
  char *pcVar12;
  int local_28c;
  int local_288;
  int local_284;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream fin;
  ostream local_1c0 [400];
  
  if ((this->super_Command).parameter.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size == 0) {
    poVar10 = (ostream *)&std::cout;
    pcVar12 = "error";
  }
  else {
    if ((this->super_Command).option.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size == 0) {
      bVar3 = true;
      bVar2 = true;
      bVar6 = true;
LAB_0010c636:
      pSVar1 = &(this->super_Command).parameter;
      local_28c = 0;
      local_288 = 0;
      local_284 = 0;
      p_Var11 = (_List_node_base *)pSVar1;
      while (p_Var11 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var11 != (_List_node_base *)pSVar1) {
        p = (string *)(p_Var11 + 1);
        FVar8 = DirUtils::GetFileType(p);
        if (FVar8 == DU_DIRECTORY) {
          std::operator+(&local_258,"wc: ",p);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                         &local_258,": Is a directory");
          poVar10 = std::operator<<((ostream *)&std::cout,(string *)&fin);
          std::endl<char,std::char_traits<char>>(poVar10);
          std::__cxx11::string::~string((string *)&fin);
          std::__cxx11::string::~string((string *)&local_258);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                         "0 0 0 ",p);
          poVar10 = std::operator<<((ostream *)&std::cout,(string *)&fin);
          std::endl<char,std::char_traits<char>>(poVar10);
          std::__cxx11::string::~string((string *)&fin);
        }
        else {
          std::ifstream::ifstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin,
                     (p->_M_dataplus)._M_p,_S_bin);
          poVar10 = local_1c0;
          cVar7 = std::__basic_file<char>::is_open();
          if (cVar7 == '\0') {
            std::operator+(&local_278,"wc: ",p);
            std::operator+(&local_258,&local_278,": No such file or directory");
            poVar10 = std::operator<<((ostream *)&std::cout,(string *)&local_258);
            std::endl<char,std::char_traits<char>>(poVar10);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_278);
          }
          else {
            if (bVar2) {
              iVar9 = CntLine((CmdWc *)poVar10,p);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
              std::operator<<(poVar10,' ');
              local_284 = local_284 + iVar9;
            }
            if (bVar3) {
              iVar9 = CntWord((CmdWc *)poVar10,p);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
              std::operator<<(poVar10,' ');
              local_288 = local_288 + iVar9;
            }
            if (bVar6) {
              iVar9 = CntByte((CmdWc *)poVar10,p);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
              std::operator<<(poVar10,' ');
              local_28c = local_28c + iVar9;
            }
            poVar10 = std::operator<<((ostream *)&std::cout,(string *)p);
            std::endl<char,std::char_traits<char>>(poVar10);
          }
          std::ifstream::~ifstream
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fin);
        }
      }
      if ((this->super_Command).parameter.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size < 2) {
        return true;
      }
      if (bVar2) {
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_284);
        std::operator<<(poVar10,' ');
      }
      if (bVar3) {
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_288);
        std::operator<<(poVar10,' ');
      }
      if (bVar6) {
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28c);
        std::operator<<(poVar10,' ');
      }
      poVar10 = std::operator<<((ostream *)&std::cout,"total");
      std::endl<char,std::char_traits<char>>(poVar10);
      return true;
    }
    pSVar1 = &(this->super_Command).option;
    bVar3 = false;
    bVar2 = false;
    p_Var11 = (_List_node_base *)pSVar1;
    bVar4 = false;
    do {
      while( true ) {
        do {
          bVar6 = bVar4;
          p_Var11 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var11 == (_List_node_base *)pSVar1) goto LAB_0010c636;
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var11 + 1)
          ;
          bVar5 = std::operator==(__lhs,"-c");
          bVar4 = true;
        } while (bVar5);
        bVar5 = std::operator==(__lhs,"-w");
        bVar4 = bVar6;
        if (!bVar5) break;
        bVar3 = true;
      }
      bVar6 = std::operator==(__lhs,"-l");
      bVar2 = true;
    } while (bVar6);
    poVar10 = std::operator<<((ostream *)&std::cout,"wc: invalid option -- \'");
    poVar10 = std::operator<<(poVar10,(string *)__lhs);
    pcVar12 = "\'";
  }
  poVar10 = std::operator<<(poVar10,pcVar12);
  std::endl<char,std::char_traits<char>>(poVar10);
  return false;
}

Assistant:

bool CmdWc::Execute(){
	if(parameter.size() == 0){
		cout << "error" << endl;
		return false;
	}
	bool byteActive = false, wordActive = false, lineActive = false;
	if(option.size() == 0){
		byteActive = wordActive = lineActive = true;
	}
	else{
		for(auto i = option.begin(); i != option.end(); i++){
			if((*i) == "-c")byteActive = true;
			else if((*i) == "-w")wordActive = true;
			else if((*i) == "-l")lineActive = true;
			else{
				cout << "wc: invalid option -- '" << (*i) << "'" << endl;	
				return false;
			}
		}
	}
	
	int byteTotal = 0, wordTotal = 0, lineTotal = 0;
	for(auto i = parameter.begin(); i != parameter.end(); i++){
		int t;
		if(GetFileType(*i) == DU_DIRECTORY){
			cout << "wc: " + (*i) + ": Is a directory" << endl;
			cout << "0 0 0 " + (*i) << endl;
			continue;
		}
		ifstream fin((*i).c_str(), ios::binary);
		if(!fin.is_open()){
			cout << "wc: " + (*i) + ": No such file or directory" << endl;
			continue;
		}
		else{
			if(lineActive){
				t = CntLine(*i);
				lineTotal += t;
				cout << t << ' ';
			}
			if(wordActive){
				t = CntWord(*i);
				wordTotal += t;
				cout << t << ' ';
			}
			if(byteActive){
				t = CntByte(*i);
				byteTotal += t;
				cout << t << ' ';
			}
			cout << (*i) << endl;
		}
	}

	if(parameter.size() > 1){
		if(lineActive)cout << lineTotal << ' ';
		if(wordActive)cout << wordTotal << ' ';
		if(byteActive)cout << byteTotal << ' ';
		cout << "total" << endl;
	}
	return true;
}